

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiSmokeTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::renderTriangleTest(TestStatus *__return_storage_ptr__,Context *context)

{
  VkPipelineDepthStencilStateCreateFlags *pVVar1;
  VkFenceCreateFlags *pVVar2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var3;
  undefined4 *puVar4;
  TestLog *log;
  VkPipelineLayout obj;
  VkDeviceSize obj_00;
  long *plVar5;
  undefined8 uVar6;
  TestStatus *pTVar7;
  undefined8 obj_01;
  undefined8 obj_02;
  bool bVar8;
  VkResult VVar9;
  VkDevice device;
  DeviceInterface *vk;
  InstanceInterface *vk_00;
  VkPhysicalDevice physicalDevice;
  const_iterator cVar10;
  deUint32 queueFamilyIndex;
  VkDeviceSize bindingOffset;
  DeviceInterface *pDStack_c70;
  undefined8 local_c68;
  VkCommandPool VStack_c60;
  undefined8 local_c58;
  undefined1 auStack_c50 [16];
  undefined8 uStack_c40;
  undefined8 local_c38;
  VkDeviceSize local_c28;
  DeviceInterface *pDStack_c20;
  undefined4 local_c18;
  undefined4 uStack_c14;
  undefined4 uStack_c10;
  undefined4 uStack_c0c;
  VkFenceCreateInfo fenceParams;
  Deleter<vk::Handle<(vk::HandleType)9>_> DStack_bd0;
  long *local_bb8;
  long *local_bb0;
  VkBuffer local_ba8;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_ba0;
  VkPipelineDepthStencilStateCreateInfo depthStencilParams;
  Deleter<vk::Handle<(vk::HandleType)17>_> DStack_b10;
  VkMemoryBarrier vertFlushBarrier;
  VkBuffer local_ac8;
  Deleter<vk::Handle<(vk::HandleType)8>_> DStack_ac0;
  TestStatus *local_aa8;
  VkQueue local_aa0;
  TextureFormat tcuFormat;
  IVec3 posDeviation;
  VkSampleMask sampleMask;
  TextureLevel refImage;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_a50;
  VkFramebuffer local_a38;
  Deleter<vk::Handle<(vk::HandleType)23>_> DStack_a30;
  VkPipeline local_a18;
  Deleter<vk::Handle<(vk::HandleType)18>_> DStack_a10;
  VkShaderModule local_9f8;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_9f0;
  VkShaderModule local_9d8;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_9d0;
  VkStructureType local_9b8;
  undefined4 uStack_9b4;
  Deleter<vk::Handle<(vk::HandleType)16>_> DStack_9b0;
  VkImageView local_998;
  Deleter<vk::Handle<(vk::HandleType)13>_> DStack_990;
  undefined1 local_978 [20];
  undefined4 uStack_964;
  undefined8 uStack_960;
  undefined8 local_958;
  undefined8 uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  UVec4 threshold;
  VkAttachmentReference colorAttRef;
  VkVertexInputBindingDescription vertexBinding0;
  VkVertexInputAttributeDescription vertexAttrib0;
  VkRect2D local_8f8;
  VkGraphicsPipelineCreateInfo pipelineParams;
  VkViewport local_6d8;
  VkCommandPoolCreateInfo cmdPoolParams;
  VkCommandBufferBeginInfo cmdBufBeginParams;
  VkPipelineColorBlendAttachmentState attBlendParams;
  VkPipelineInputAssemblyStateCreateInfo inputAssemblyParams;
  VkSpecializationInfo emptyShaderSpecParams;
  VkCommandBufferAllocateInfo cmdBufParams;
  VkAttachmentDescription colorAttDesc;
  VkPipelineLayoutCreateInfo pipelineLayoutParams;
  VkPipelineVertexInputStateCreateInfo vertexInputStateParams;
  VkPipelineMultisampleStateCreateInfo multisampleParams;
  VkPipelineViewportStateCreateInfo viewportParams;
  VkPipelineColorBlendStateCreateInfo local_510;
  VkBufferCreateInfo readImageBufferParams;
  VkBufferCreateInfo vertexBufferParams;
  VkPipelineRasterizationStateCreateInfo rasterParams;
  VkFramebufferCreateInfo framebufferParams;
  VkRenderPassCreateInfo renderPassParams;
  VkSubpassDescription local_3a8;
  VkImageViewCreateInfo local_360;
  VkImageCreateInfo local_310;
  VkPipelineShaderStageCreateInfo shaderStageParams [2];
  SimpleAllocator memAlloc;
  
  local_aa8 = __return_storage_ptr__;
  device = Context::getDevice(context);
  vk = Context::getDeviceInterface(context);
  local_aa0 = Context::getUniversalQueue(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  vk_00 = Context::getInstanceInterface(context);
  physicalDevice = Context::getPhysicalDevice(context);
  ::vk::getPhysicalDeviceMemoryProperties
            ((VkPhysicalDeviceMemoryProperties *)&pipelineParams,vk_00,physicalDevice);
  ::vk::SimpleAllocator::SimpleAllocator
            (&memAlloc,vk,device,(VkPhysicalDeviceMemoryProperties *)&pipelineParams);
  local_978._0_8_ = 0x3e8000003e000000;
  local_978._8_8_ = (void *)0x3f8000003f400000;
  stack0xfffffffffffff698 = 0xbf000000bf000000;
  uStack_960 = 0x3f80000000000000;
  local_958 = 0xbf0000003f000000;
  uStack_950 = 0x3f80000000000000;
  local_948 = 0x3f00000000000000;
  uStack_940 = 0x3f80000000000000;
  vertexBufferParams.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  vertexBufferParams.pNext = (void *)0x0;
  vertexBufferParams.flags = 0;
  vertexBufferParams.size = 0x30;
  vertexBufferParams.usage = 0x80;
  vertexBufferParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  vertexBufferParams.queueFamilyIndexCount = 1;
  vertexBufferParams.pQueueFamilyIndices = &queueFamilyIndex;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&pipelineParams,vk,device,
                     &vertexBufferParams,(VkAllocationCallbacks *)0x0);
  DStack_ac0.m_device = (VkDevice)pipelineParams._16_8_;
  DStack_ac0.m_allocator = (VkAllocationCallbacks *)pipelineParams.pStages;
  local_ac8.m_internal = pipelineParams._0_8_;
  DStack_ac0.m_deviceIface = (DeviceInterface *)pipelineParams.pNext;
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)&pipelineParams,vk,device,(VkBuffer)pipelineParams._0_8_);
  ::vk::SimpleAllocator::allocate
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&depthStencilParams,
             &memAlloc,(VkMemoryRequirements *)&pipelineParams,(MemoryRequirement)0x1);
  local_bb0 = (long *)depthStencilParams._0_8_;
  VVar9 = (*vk->_vptr_DeviceInterface[0xc])
                    (vk,device,local_ac8.m_internal,*(undefined8 *)(depthStencilParams._0_8_ + 8));
  ::vk::checkResult(VVar9,
                    "vk.bindBufferMemory(vkDevice, *vertexBuffer, vertexBufferMemory->getMemory(), vertexBufferMemory->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x16a);
  readImageBufferParams.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
  readImageBufferParams.pNext = (void *)0x0;
  readImageBufferParams.flags = 0;
  readImageBufferParams.size = 0x40000;
  readImageBufferParams.usage = 2;
  readImageBufferParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  readImageBufferParams.queueFamilyIndexCount = 1;
  readImageBufferParams.pQueueFamilyIndices = &queueFamilyIndex;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)&pipelineParams,vk,device,
                     &readImageBufferParams,(VkAllocationCallbacks *)0x0);
  DStack_ba0.m_device = (VkDevice)pipelineParams._16_8_;
  DStack_ba0.m_allocator = (VkAllocationCallbacks *)pipelineParams.pStages;
  local_ba8.m_internal = pipelineParams._0_8_;
  DStack_ba0.m_deviceIface = (DeviceInterface *)pipelineParams.pNext;
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)&pipelineParams,vk,device,(VkBuffer)pipelineParams._0_8_);
  ::vk::SimpleAllocator::allocate
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&depthStencilParams,
             &memAlloc,(VkMemoryRequirements *)&pipelineParams,(MemoryRequirement)0x1);
  uVar6 = depthStencilParams._0_8_;
  VVar9 = (*vk->_vptr_DeviceInterface[0xc])
                    (vk,device,local_ba8.m_internal,*(undefined8 *)(depthStencilParams._0_8_ + 8));
  ::vk::checkResult(VVar9,
                    "vk.bindBufferMemory(vkDevice, *readImageBuffer, readImageBufferMemory->getMemory(), readImageBufferMemory->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x17b);
  local_310.sType = VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO;
  local_310.pNext = (void *)0x0;
  local_310.flags = 0;
  local_310.imageType = VK_IMAGE_TYPE_2D;
  local_310.format = VK_FORMAT_R8G8B8A8_UNORM;
  local_310.extent.width = 0x100;
  local_310.extent.height = 0x100;
  local_310.extent.depth = 1;
  local_310.mipLevels = 1;
  local_310.arrayLayers = 1;
  local_310.samples = VK_SAMPLE_COUNT_1_BIT;
  local_310.tiling = VK_IMAGE_TILING_OPTIMAL;
  local_310.usage = 0x11;
  local_310.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
  local_310.queueFamilyIndexCount = 1;
  local_310.initialLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  local_310.pQueueFamilyIndices = &queueFamilyIndex;
  ::vk::createImage((Move<vk::Handle<(vk::HandleType)9>_> *)&pipelineParams,vk,device,&local_310,
                    (VkAllocationCallbacks *)0x0);
  obj_01 = pipelineParams._0_8_;
  DStack_bd0.m_device = (VkDevice)pipelineParams._16_8_;
  DStack_bd0.m_allocator = (VkAllocationCallbacks *)pipelineParams.pStages;
  DStack_bd0.m_deviceIface = (DeviceInterface *)pipelineParams.pNext;
  ::vk::getImageMemoryRequirements
            ((VkMemoryRequirements *)&pipelineParams,vk,device,(VkImage)pipelineParams._0_8_);
  ::vk::SimpleAllocator::allocate
            ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&depthStencilParams,
             &memAlloc,(VkMemoryRequirements *)&pipelineParams,(MemoryRequirement)0x0);
  local_bb8 = (long *)depthStencilParams._0_8_;
  VVar9 = (*vk->_vptr_DeviceInterface[0xd])
                    (vk,device,obj_01,*(undefined8 *)(depthStencilParams._0_8_ + 8),
                     *(undefined8 *)(depthStencilParams._0_8_ + 0x10));
  ::vk::checkResult(VVar9,
                    "vk.bindImageMemory(vkDevice, *image, imageMemory->getMemory(), imageMemory->getOffset())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x193);
  renderPassParams.pAttachments = &colorAttDesc;
  colorAttDesc.storeOp = VK_ATTACHMENT_STORE_OP_STORE;
  colorAttDesc.stencilLoadOp = VK_ATTACHMENT_LOAD_OP_DONT_CARE;
  colorAttDesc.stencilStoreOp = VK_ATTACHMENT_STORE_OP_DONT_CARE;
  colorAttDesc.initialLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  colorAttDesc.flags = 0;
  colorAttDesc.format = VK_FORMAT_R8G8B8A8_UNORM;
  colorAttDesc.samples = VK_SAMPLE_COUNT_1_BIT;
  colorAttDesc.loadOp = VK_ATTACHMENT_LOAD_OP_CLEAR;
  colorAttDesc.finalLayout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  local_3a8.pColorAttachments = &colorAttRef;
  colorAttRef.attachment = 0;
  colorAttRef.layout = VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL;
  renderPassParams.pSubpasses = &local_3a8;
  local_3a8.pInputAttachments = (VkAttachmentReference *)0x0;
  local_3a8.pResolveAttachments = (VkAttachmentReference *)0x0;
  local_3a8.pPreserveAttachments = (deUint32 *)0x0;
  local_3a8.pDepthStencilAttachment = (VkAttachmentReference *)0x0;
  local_3a8.preserveAttachmentCount = 0;
  local_3a8._60_4_ = 0;
  local_3a8.flags = 0;
  local_3a8.pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
  local_3a8.inputAttachmentCount = 0;
  local_3a8._12_4_ = 0;
  local_3a8.colorAttachmentCount = 1;
  local_3a8._28_4_ = 0;
  renderPassParams.sType = VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO;
  renderPassParams.pNext = (void *)0x0;
  renderPassParams.flags = 0;
  renderPassParams.attachmentCount = 1;
  renderPassParams.subpassCount = 1;
  renderPassParams.dependencyCount = 0;
  renderPassParams.pDependencies = (VkSubpassDependency *)0x0;
  ::vk::createRenderPass
            ((Move<vk::Handle<(vk::HandleType)17>_> *)&pipelineParams,vk,device,&renderPassParams,
             (VkAllocationCallbacks *)0x0);
  obj_02 = pipelineParams._0_8_;
  DStack_b10.m_device = (VkDevice)pipelineParams._16_8_;
  DStack_b10.m_allocator = (VkAllocationCallbacks *)pipelineParams.pStages;
  DStack_b10.m_deviceIface = (DeviceInterface *)pipelineParams.pNext;
  local_360.sType = VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO;
  local_360.pNext = (void *)0x0;
  local_360.flags = 0;
  local_360.image.m_internal = obj_01;
  local_360.viewType = VK_IMAGE_VIEW_TYPE_2D;
  local_360.format = VK_FORMAT_R8G8B8A8_UNORM;
  local_360.components.r = VK_COMPONENT_SWIZZLE_R;
  local_360.components.g = VK_COMPONENT_SWIZZLE_G;
  local_360.components.b = VK_COMPONENT_SWIZZLE_B;
  local_360.components.a = VK_COMPONENT_SWIZZLE_A;
  local_360.subresourceRange.aspectMask = 1;
  local_360.subresourceRange.baseMipLevel = 0;
  local_360.subresourceRange.levelCount = 1;
  local_360.subresourceRange.baseArrayLayer = 0;
  local_360.subresourceRange.layerCount = 1;
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&pipelineParams,vk,device,&local_360,
             (VkAllocationCallbacks *)0x0);
  DStack_990.m_device = (VkDevice)pipelineParams._16_8_;
  DStack_990.m_allocator = (VkAllocationCallbacks *)pipelineParams.pStages;
  local_998.m_internal = pipelineParams._0_8_;
  DStack_990.m_deviceIface = (DeviceInterface *)pipelineParams.pNext;
  pipelineLayoutParams.pNext = (void *)0x0;
  pipelineLayoutParams.pushConstantRangeCount = 0;
  pipelineLayoutParams._36_4_ = 0;
  pipelineLayoutParams.pPushConstantRanges = (VkPushConstantRange *)0x0;
  pipelineLayoutParams.flags = 0;
  pipelineLayoutParams.setLayoutCount = 0;
  pipelineLayoutParams.pSetLayouts = (VkDescriptorSetLayout *)0x0;
  pipelineLayoutParams.sType = VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO;
  pipelineLayoutParams._4_4_ = 0;
  ::vk::createPipelineLayout
            ((Move<vk::Handle<(vk::HandleType)16>_> *)&pipelineParams,vk,device,
             &pipelineLayoutParams,(VkAllocationCallbacks *)0x0);
  DStack_9b0.m_device._0_4_ = pipelineParams.flags;
  DStack_9b0.m_device._4_4_ = pipelineParams.stageCount;
  DStack_9b0.m_allocator._0_4_ = pipelineParams.pStages._0_4_;
  DStack_9b0.m_allocator._4_4_ = pipelineParams.pStages._4_4_;
  local_9b8 = pipelineParams.sType;
  uStack_9b4 = pipelineParams._4_4_;
  DStack_9b0.m_deviceIface._0_4_ = pipelineParams.pNext._0_4_;
  DStack_9b0.m_deviceIface._4_4_ = pipelineParams.pNext._4_4_;
  p_Var3 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  pVVar1 = &depthStencilParams.flags;
  depthStencilParams._0_8_ = pVVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&depthStencilParams,"vert","");
  cVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var3,(key_type *)&depthStencilParams);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&pipelineParams,vk,device,
             *(ProgramBinary **)(cVar10._M_node + 2),0);
  DStack_9d0.m_device = (VkDevice)pipelineParams._16_8_;
  DStack_9d0.m_allocator = (VkAllocationCallbacks *)pipelineParams.pStages;
  local_9d8.m_internal = pipelineParams._0_8_;
  DStack_9d0.m_deviceIface = (DeviceInterface *)pipelineParams.pNext;
  pipelineParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineParams._4_4_ = 0;
  pipelineParams.pNext = (void *)0x0;
  pipelineParams.flags = 0;
  pipelineParams.stageCount = 0;
  pipelineParams.pStages = (VkPipelineShaderStageCreateInfo *)0x0;
  if ((VkPipelineDepthStencilStateCreateFlags *)depthStencilParams._0_8_ != pVVar1) {
    operator_delete((void *)depthStencilParams._0_8_,depthStencilParams._16_8_ + 1);
  }
  p_Var3 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_progCollection;
  depthStencilParams._0_8_ = pVVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&depthStencilParams,"frag","");
  cVar10 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find(p_Var3,(key_type *)&depthStencilParams);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&pipelineParams,vk,device,
             *(ProgramBinary **)(cVar10._M_node + 2),0);
  DStack_9f0.m_device = (VkDevice)pipelineParams._16_8_;
  DStack_9f0.m_allocator = (VkAllocationCallbacks *)pipelineParams.pStages;
  local_9f8.m_internal = pipelineParams._0_8_;
  DStack_9f0.m_deviceIface = (DeviceInterface *)pipelineParams.pNext;
  pipelineParams.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineParams._4_4_ = 0;
  pipelineParams.pNext = (void *)0x0;
  pipelineParams.flags = 0;
  pipelineParams.stageCount = 0;
  pipelineParams.pStages = (VkPipelineShaderStageCreateInfo *)0x0;
  if ((VkPipelineDepthStencilStateCreateFlags *)depthStencilParams._0_8_ != pVVar1) {
    operator_delete((void *)depthStencilParams._0_8_,depthStencilParams._16_8_ + 1);
  }
  shaderStageParams[0].pSpecializationInfo = &emptyShaderSpecParams;
  emptyShaderSpecParams.dataSize = 0;
  emptyShaderSpecParams.pData = (void *)0x0;
  emptyShaderSpecParams.mapEntryCount = 0;
  emptyShaderSpecParams._4_4_ = 0;
  emptyShaderSpecParams.pMapEntries = (VkSpecializationMapEntry *)0x0;
  pipelineParams.pStages = shaderStageParams;
  shaderStageParams[0].sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  shaderStageParams[0].pNext = (void *)0x0;
  shaderStageParams[0].flags = 0;
  shaderStageParams[0].stage = VK_SHADER_STAGE_VERTEX_BIT;
  shaderStageParams[0].module.m_internal = local_9d8.m_internal;
  shaderStageParams[0].pName = "main";
  shaderStageParams[1].sType = VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO;
  shaderStageParams[1].pNext = (void *)0x0;
  shaderStageParams[1].flags = 0;
  shaderStageParams[1].stage = VK_SHADER_STAGE_FRAGMENT_BIT;
  shaderStageParams[1].module.m_internal = local_9f8.m_internal;
  shaderStageParams[1].pName = "main";
  depthStencilParams.pNext = (void *)0x0;
  depthStencilParams.flags = 0;
  depthStencilParams.depthTestEnable = 0;
  depthStencilParams.front.compareMask = 0;
  depthStencilParams.front.writeMask = 0;
  depthStencilParams.back.writeMask = 0;
  depthStencilParams.back.reference = 0;
  depthStencilParams.front.reference = 0;
  depthStencilParams.back.failOp = VK_STENCIL_OP_KEEP;
  depthStencilParams.back.passOp = VK_STENCIL_OP_KEEP;
  depthStencilParams.back.depthFailOp = VK_STENCIL_OP_KEEP;
  depthStencilParams.depthBoundsTestEnable = 0;
  depthStencilParams.stencilTestEnable = 0;
  depthStencilParams.front.failOp = VK_STENCIL_OP_KEEP;
  depthStencilParams.front.passOp = VK_STENCIL_OP_KEEP;
  depthStencilParams.sType = VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO;
  depthStencilParams._4_4_ = 0;
  depthStencilParams.depthWriteEnable = 0;
  depthStencilParams.depthCompareOp = VK_COMPARE_OP_ALWAYS;
  depthStencilParams.front.depthFailOp = VK_STENCIL_OP_KEEP;
  depthStencilParams.front.compareOp = VK_COMPARE_OP_ALWAYS;
  depthStencilParams.back.compareOp = VK_COMPARE_OP_ALWAYS;
  depthStencilParams.back.compareMask = 0;
  depthStencilParams.minDepthBounds = 0.0;
  depthStencilParams.maxDepthBounds = 1.0;
  viewportParams.pViewports = &local_6d8;
  local_6d8.x = 0.0;
  local_6d8.y = 0.0;
  local_6d8.width = 256.0;
  local_6d8.height = 256.0;
  local_6d8.minDepth = 0.0;
  local_6d8.maxDepth = 1.0;
  viewportParams.pScissors = &local_8f8;
  local_8f8.offset.x = 0;
  local_8f8.offset.y = 0;
  local_8f8.extent.width = 0x100;
  local_8f8.extent.height = 0x100;
  pipelineParams.pViewportState = &viewportParams;
  viewportParams.sType = VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO;
  viewportParams.pNext = (void *)0x0;
  viewportParams.flags = 0;
  viewportParams.viewportCount = 1;
  viewportParams.scissorCount = 1;
  multisampleParams.pSampleMask = &sampleMask;
  sampleMask = 0xffffffff;
  pipelineParams.pMultisampleState = &multisampleParams;
  multisampleParams.sType = VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO;
  multisampleParams.pNext = (void *)0x0;
  multisampleParams.flags = 0;
  multisampleParams.rasterizationSamples = VK_SAMPLE_COUNT_1_BIT;
  multisampleParams.sampleShadingEnable = 0;
  multisampleParams.minSampleShading = 0.0;
  multisampleParams.alphaToCoverageEnable = 0;
  multisampleParams.alphaToOneEnable = 0;
  pipelineParams.pRasterizationState = &rasterParams;
  rasterParams.pNext = (void *)0x0;
  rasterParams.rasterizerDiscardEnable = 0;
  rasterParams.polygonMode = VK_POLYGON_MODE_FILL;
  rasterParams.depthBiasClamp = 0.0;
  rasterParams.depthBiasSlopeFactor = 0.0;
  rasterParams.cullMode = 0;
  rasterParams.frontFace = VK_FRONT_FACE_COUNTER_CLOCKWISE;
  rasterParams.depthBiasEnable = 0;
  rasterParams.depthBiasConstantFactor = 0.0;
  rasterParams.sType = VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO;
  rasterParams._4_4_ = 0;
  rasterParams.flags = 0;
  rasterParams.depthClampEnable = 1;
  rasterParams.lineWidth = 1.0;
  rasterParams._60_4_ = 0;
  pipelineParams.pInputAssemblyState = &inputAssemblyParams;
  inputAssemblyParams.flags = 0;
  inputAssemblyParams.topology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  inputAssemblyParams.primitiveRestartEnable = 0;
  inputAssemblyParams._28_4_ = 0;
  inputAssemblyParams.sType = VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO;
  inputAssemblyParams._4_4_ = 0;
  inputAssemblyParams.pNext = (void *)0x0;
  vertexInputStateParams.pVertexBindingDescriptions = &vertexBinding0;
  vertexBinding0.inputRate = VK_VERTEX_INPUT_RATE_VERTEX;
  vertexBinding0.binding = 0;
  vertexBinding0.stride = 0x10;
  vertexInputStateParams.pVertexAttributeDescriptions = &vertexAttrib0;
  vertexAttrib0.location = 0;
  vertexAttrib0.binding = 0;
  vertexAttrib0.format = VK_FORMAT_R32G32B32A32_SFLOAT;
  vertexAttrib0.offset = 0;
  pipelineParams.pVertexInputState = &vertexInputStateParams;
  vertexInputStateParams.sType = VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO;
  vertexInputStateParams.pNext = (void *)0x0;
  vertexInputStateParams.flags = 0;
  vertexInputStateParams.vertexBindingDescriptionCount = 1;
  vertexInputStateParams.vertexAttributeDescriptionCount = 1;
  local_510.pAttachments = &attBlendParams;
  attBlendParams.srcAlphaBlendFactor = VK_BLEND_FACTOR_ONE;
  attBlendParams.dstAlphaBlendFactor = VK_BLEND_FACTOR_ZERO;
  attBlendParams.alphaBlendOp = VK_BLEND_OP_ADD;
  attBlendParams.colorWriteMask = 0xf;
  attBlendParams.blendEnable = 0;
  attBlendParams.srcColorBlendFactor = VK_BLEND_FACTOR_ONE;
  attBlendParams.dstColorBlendFactor = VK_BLEND_FACTOR_ZERO;
  attBlendParams.colorBlendOp = VK_BLEND_OP_ADD;
  pipelineParams.pColorBlendState = &local_510;
  local_510.sType = VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO;
  local_510.pNext = (void *)0x0;
  local_510.flags = 0;
  local_510.logicOpEnable = 0;
  local_510.logicOp = VK_LOGIC_OP_COPY;
  local_510.attachmentCount = 1;
  local_510.blendConstants[0] = 0.0;
  local_510.blendConstants[1] = 0.0;
  local_510.blendConstants[2] = 0.0;
  local_510.blendConstants[3] = 0.0;
  pipelineParams.sType = VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO;
  pipelineParams.pNext = (void *)0x0;
  pipelineParams.flags = 0;
  pipelineParams.stageCount = 2;
  pipelineParams.pTessellationState = (VkPipelineTessellationStateCreateInfo *)0x0;
  pipelineParams.pDynamicState = (VkPipelineDynamicStateCreateInfo *)0x0;
  pipelineParams.layout.m_internal = CONCAT44(uStack_9b4,local_9b8);
  pipelineParams.renderPass.m_internal = obj_02;
  pipelineParams.subpass = 0;
  pipelineParams.basePipelineHandle.m_internal = 0;
  pipelineParams.basePipelineIndex = 0;
  pipelineParams.pDepthStencilState = &depthStencilParams;
  shaderStageParams[1].pSpecializationInfo = shaderStageParams[0].pSpecializationInfo;
  ::vk::createGraphicsPipeline
            ((Move<vk::Handle<(vk::HandleType)18>_> *)&bindingOffset,vk,device,(VkPipelineCache)0x0,
             &pipelineParams,(VkAllocationCallbacks *)0x0);
  plVar5 = local_bb0;
  DStack_a10.m_device = local_c68;
  DStack_a10.m_allocator = (VkAllocationCallbacks *)VStack_c60.m_internal;
  local_a18.m_internal = bindingOffset;
  DStack_a10.m_deviceIface = pDStack_c70;
  framebufferParams.sType = VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO;
  framebufferParams.pNext = (void *)0x0;
  framebufferParams.flags = 0;
  framebufferParams.renderPass.m_internal = obj_02;
  framebufferParams.attachmentCount = 1;
  framebufferParams.pAttachments = &local_998;
  framebufferParams.width = 0x100;
  framebufferParams.height = 0x100;
  framebufferParams.layers = 1;
  ::vk::createFramebuffer
            ((Move<vk::Handle<(vk::HandleType)23>_> *)&bindingOffset,vk,device,&framebufferParams,
             (VkAllocationCallbacks *)0x0);
  DStack_a30.m_device = local_c68;
  DStack_a30.m_allocator = (VkAllocationCallbacks *)VStack_c60.m_internal;
  local_a38.m_internal = bindingOffset;
  DStack_a30.m_deviceIface = pDStack_c70;
  cmdPoolParams.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  cmdPoolParams.pNext = (void *)0x0;
  cmdPoolParams.flags = 2;
  cmdPoolParams.queueFamilyIndex = queueFamilyIndex;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&bindingOffset,vk,device,&cmdPoolParams,
             (VkAllocationCallbacks *)0x0);
  obj_00 = bindingOffset;
  DStack_a50.m_device = local_c68;
  DStack_a50.m_allocator = (VkAllocationCallbacks *)VStack_c60.m_internal;
  DStack_a50.m_deviceIface = pDStack_c70;
  cmdBufParams.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  cmdBufParams.pNext = (void *)0x0;
  cmdBufParams.commandPool.m_internal = bindingOffset;
  cmdBufParams.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
  cmdBufParams.commandBufferCount = 1;
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&bindingOffset,vk,device,&cmdBufParams);
  local_c18 = (undefined4)local_c68;
  uStack_c14 = local_c68._4_4_;
  uStack_c10 = (deUint32)VStack_c60.m_internal;
  uStack_c0c = VStack_c60.m_internal._4_4_;
  local_c28 = bindingOffset;
  pDStack_c20 = pDStack_c70;
  VVar9 = (*vk->_vptr_DeviceInterface[0x49])(vk,bindingOffset);
  ::vk::checkResult(VVar9,"vk.beginCommandBuffer(*cmdBuf, &cmdBufBeginParams)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x2de);
  vertFlushBarrier.srcAccessMask = 0x4000;
  vertFlushBarrier.dstAccessMask = 4;
  vertFlushBarrier.sType = VK_STRUCTURE_TYPE_MEMORY_BARRIER;
  vertFlushBarrier._4_4_ = 0;
  vertFlushBarrier.pNext = (void *)0x0;
  bindingOffset = CONCAT44(bindingOffset._4_4_,0x2d);
  pDStack_c70 = (DeviceInterface *)0x0;
  local_c68 = (VkDevice)0x18000000000;
  VStack_c60.m_internal = 0x200000000;
  local_c58 = CONCAT44(queueFamilyIndex,queueFamilyIndex);
  auStack_c50._0_8_ = obj_01;
  auStack_c50._8_8_ = 1;
  uStack_c40 = (VkMemoryBarrier *)0x1;
  local_c38._0_4_ = 1;
  (*vk->_vptr_DeviceInterface[0x6d])
            (vk,local_c28,0x4000,0x10000,0,1,&vertFlushBarrier,0,0,1,
             (Move<vk::VkCommandBuffer_s_*> *)&bindingOffset);
  vertFlushBarrier._0_8_ = local_978._0_8_;
  vertFlushBarrier.pNext = (void *)local_978._8_8_;
  bindingOffset = CONCAT44(bindingOffset._4_4_,0x2b);
  pDStack_c70 = (DeviceInterface *)0x0;
  local_c68 = (VkDevice)obj_02;
  VStack_c60.m_internal = local_a38.m_internal;
  local_c58 = 0;
  auStack_c50._0_8_ = 0x10000000100;
  auStack_c50._8_4_ = 1;
  uStack_c40 = &vertFlushBarrier;
  (*vk->_vptr_DeviceInterface[0x74])(vk,local_c28,&bindingOffset,0);
  (*vk->_vptr_DeviceInterface[0x4c])(vk,local_c28,0,local_a18.m_internal);
  bindingOffset = 0;
  (*vk->_vptr_DeviceInterface[0x58])(vk,local_c28,0,1,&local_ac8,&bindingOffset);
  (*vk->_vptr_DeviceInterface[0x59])(vk,local_c28,3,1,0,0);
  (*vk->_vptr_DeviceInterface[0x76])(vk,local_c28);
  bindingOffset = CONCAT44(bindingOffset._4_4_,0x2d);
  pDStack_c70 = (DeviceInterface *)0x0;
  local_c68 = (VkDevice)0x80000000100;
  VStack_c60.m_internal = 0x600000002;
  local_c58 = CONCAT44(queueFamilyIndex,queueFamilyIndex);
  auStack_c50._0_8_ = obj_01;
  auStack_c50._8_8_ = 1;
  uStack_c40 = (VkMemoryBarrier *)0x1;
  local_c38 = CONCAT44(local_c38._4_4_,1);
  (*vk->_vptr_DeviceInterface[0x6d])(vk,local_c28,0x8000,0x1000,0,0,0,0,0,1,&bindingOffset);
  bindingOffset = 0;
  pDStack_c70 = (DeviceInterface *)0x10000000100;
  local_c68 = (VkDevice)&DAT_00000001;
  VStack_c60.m_internal = 0x100000000;
  local_c58 = 0;
  auStack_c50._0_8_ = 0x10000000000;
  auStack_c50._8_8_ = 0x100000100;
  (*vk->_vptr_DeviceInterface[99])(vk,local_c28,obj_01,6,local_ba8.m_internal,1,&bindingOffset);
  bindingOffset = CONCAT44(bindingOffset._4_4_,0x2c);
  pDStack_c70 = (DeviceInterface *)0x0;
  local_c68 = (VkDevice)0x200000001000;
  VStack_c60.m_internal._4_4_ = queueFamilyIndex;
  VStack_c60.m_internal._0_4_ = queueFamilyIndex;
  local_c58 = local_ba8.m_internal;
  auStack_c50._0_8_ = 0;
  auStack_c50._8_8_ = 0x40000;
  (*vk->_vptr_DeviceInterface[0x6d])(vk,local_c28,0x1000,0x4000,0,0,0,1,&bindingOffset,0,0);
  VVar9 = (*vk->_vptr_DeviceInterface[0x4a])(vk,local_c28);
  ::vk::checkResult(VVar9,"vk.endCommandBuffer(*cmdBuf)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x359);
  bindingOffset = CONCAT44(bindingOffset._4_4_,6);
  pDStack_c70 = (DeviceInterface *)0x0;
  local_c68 = (VkDevice)plVar5[1];
  VStack_c60.m_internal = 0;
  local_c58 = 0x30;
  puVar4 = (undefined4 *)plVar5[3];
  puVar4[8] = (undefined4)local_948;
  puVar4[9] = local_948._4_4_;
  puVar4[10] = (undefined4)uStack_940;
  puVar4[0xb] = uStack_940._4_4_;
  puVar4[4] = (undefined4)local_958;
  puVar4[5] = local_958._4_4_;
  puVar4[6] = (undefined4)uStack_950;
  puVar4[7] = uStack_950._4_4_;
  *puVar4 = local_978._16_4_;
  puVar4[1] = uStack_964;
  puVar4[2] = (undefined4)uStack_960;
  puVar4[3] = uStack_960._4_4_;
  VVar9 = (*vk->_vptr_DeviceInterface[9])(vk,device,1);
  ::vk::checkResult(VVar9,"vk.flushMappedMemoryRanges(vkDevice, 1u, &range)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x368);
  fenceParams.flags = 0;
  fenceParams._20_4_ = 0;
  fenceParams.sType = VK_STRUCTURE_TYPE_FENCE_CREATE_INFO;
  fenceParams._4_4_ = 0;
  fenceParams.pNext = (void *)0x0;
  pDStack_c70 = (DeviceInterface *)0x0;
  local_c58 = 0;
  uStack_c40 = (VkMemoryBarrier *)0x0;
  local_c68 = (VkDevice)0x0;
  VStack_c60.m_internal = 0;
  local_c38 = 0;
  bindingOffset = 4;
  auStack_c50._0_8_ = 1;
  auStack_c50._8_8_ = &local_c28;
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&refImage,vk,device,&fenceParams,
                    (VkAllocationCallbacks *)0x0);
  vertFlushBarrier._4_4_ = refImage.m_format.type;
  vertFlushBarrier.sType = refImage.m_format.order;
  VVar9 = (*vk->_vptr_DeviceInterface[2])(vk,local_aa0,1,&bindingOffset,vertFlushBarrier._0_8_);
  ::vk::checkResult(VVar9,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x381);
  VVar9 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&vertFlushBarrier,1,0xffffffffffffffff);
  ::vk::checkResult(VVar9,"vk.waitForFences(vkDevice, 1u, &fence.get(), DE_TRUE, ~0ull)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x382);
  if (vertFlushBarrier._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)6>_> *)&vertFlushBarrier.pNext,
               (VkFence)vertFlushBarrier._0_8_);
  }
  tcuFormat = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  bindingOffset = CONCAT44(bindingOffset._4_4_,6);
  pDStack_c70 = (DeviceInterface *)0x0;
  local_c68 = *(VkDevice *)(uVar6 + 8);
  VStack_c60.m_internal = 0;
  local_c58 = 0x40000;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)&vertFlushBarrier,&tcuFormat,0x100,0x100,1,
             *(void **)(uVar6 + 0x18));
  VVar9 = (*vk->_vptr_DeviceInterface[10])(vk,device,1,&bindingOffset);
  ::vk::checkResult(VVar9,"vk.invalidateMappedMemoryRanges(vkDevice, 1u, &range)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiSmokeTests.cpp"
                    ,0x392);
  tcu::TextureLevel::TextureLevel(&refImage,&tcuFormat,0x100,0x100,1);
  threshold.m_data[0] = 0;
  threshold.m_data[1] = 0;
  threshold.m_data[2] = 0;
  threshold.m_data[3] = 0;
  posDeviation.m_data[0] = 1;
  posDeviation.m_data[1] = 1;
  posDeviation.m_data[2] = 0;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&fenceParams,&refImage);
  tcu::clear((PixelBufferAccess *)&fenceParams,(Vec4 *)local_978);
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&fenceParams,&refImage);
  renderReferenceTriangle((PixelBufferAccess *)&fenceParams,(Vec4 (*) [3])(local_978 + 0x10));
  log = context->m_testCtx->m_log;
  tcu::TextureLevel::getAccess((PixelBufferAccess *)&fenceParams,&refImage);
  bVar8 = tcu::intThresholdPositionDeviationCompare
                    (log,"ComparisonResult","Image comparison result",
                     (ConstPixelBufferAccess *)&fenceParams,
                     (ConstPixelBufferAccess *)&vertFlushBarrier,&threshold,&posDeviation,false,
                     COMPARE_LOG_RESULT);
  pTVar7 = local_aa8;
  pVVar2 = &fenceParams.flags;
  fenceParams._0_8_ = pVVar2;
  if (bVar8) {
    std::__cxx11::string::_M_construct<char_const*>((string *)&fenceParams,"Rendering succeeded","")
    ;
    pTVar7->m_code = QP_TEST_RESULT_PASS;
    (pTVar7->m_description)._M_dataplus._M_p = (pointer)&(pTVar7->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar7->m_description,fenceParams._0_8_,
               (long)fenceParams.pNext + fenceParams._0_8_);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&fenceParams,"Image comparison failed","");
    pTVar7->m_code = QP_TEST_RESULT_FAIL;
    (pTVar7->m_description)._M_dataplus._M_p = (pointer)&(pTVar7->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pTVar7->m_description,fenceParams._0_8_,
               (long)fenceParams.pNext + fenceParams._0_8_);
  }
  if ((VkFenceCreateFlags *)fenceParams._0_8_ != pVVar2) {
    operator_delete((void *)fenceParams._0_8_,fenceParams._16_8_ + 1);
  }
  tcu::TextureLevel::~TextureLevel(&refImage);
  if (local_c28 != 0) {
    bindingOffset = local_c28;
    (*pDStack_c20->_vptr_DeviceInterface[0x48])
              (pDStack_c20,CONCAT44(uStack_c14,local_c18),CONCAT44(uStack_c0c,uStack_c10),1);
  }
  if (obj_00 != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
              (&DStack_a50,(VkCommandPool)obj_00);
  }
  if (local_a38.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()(&DStack_a30,local_a38);
  }
  if (local_a18.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()(&DStack_a10,local_a18);
  }
  if (local_9f8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_9f0,local_9f8);
  }
  if (local_9d8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_9d0,local_9d8);
  }
  obj.m_internal._4_4_ = uStack_9b4;
  obj.m_internal._0_4_ = local_9b8;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()(&DStack_9b0,obj);
  }
  if (local_998.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()(&DStack_990,local_998);
  }
  if (obj_02 != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              (&DStack_b10,(VkRenderPass)obj_02);
  }
  (**(code **)(*local_bb8 + 8))();
  if (obj_01 != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)9>_>::operator()
              (&DStack_bd0,(VkImage)obj_01);
  }
  (**(code **)(*(long *)uVar6 + 8))();
  if (local_ba8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_ba0,local_ba8);
  }
  (**(code **)(*plVar5 + 8))(plVar5);
  if (local_ac8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()(&DStack_ac0,local_ac8);
  }
  return pTVar7;
}

Assistant:

tcu::TestStatus renderTriangleTest (Context& context)
{
	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const VkQueue							queue					= context.getUniversalQueue();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();
	SimpleAllocator							memAlloc				(vk, vkDevice, getPhysicalDeviceMemoryProperties(context.getInstanceInterface(), context.getPhysicalDevice()));
	const tcu::IVec2						renderSize				(256, 256);
	const VkFormat							colorFormat				= VK_FORMAT_R8G8B8A8_UNORM;
	const tcu::Vec4							clearColor				(0.125f, 0.25f, 0.75f, 1.0f);

	const tcu::Vec4							vertices[]				=
	{
		tcu::Vec4(-0.5f, -0.5f, 0.0f, 1.0f),
		tcu::Vec4(+0.5f, -0.5f, 0.0f, 1.0f),
		tcu::Vec4( 0.0f, +0.5f, 0.0f, 1.0f)
	};

	const VkBufferCreateInfo				vertexBufferParams		=
	{
		VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,	// sType
		DE_NULL,								// pNext
		0u,										// flags
		(VkDeviceSize)sizeof(vertices),			// size
		VK_BUFFER_USAGE_VERTEX_BUFFER_BIT,		// usage
		VK_SHARING_MODE_EXCLUSIVE,				// sharingMode
		1u,										// queueFamilyIndexCount
		&queueFamilyIndex,						// pQueueFamilyIndices
	};
	const Unique<VkBuffer>					vertexBuffer			(createBuffer(vk, vkDevice, &vertexBufferParams));
	const UniquePtr<Allocation>				vertexBufferMemory		(memAlloc.allocate(getBufferMemoryRequirements(vk, vkDevice, *vertexBuffer), MemoryRequirement::HostVisible));

	VK_CHECK(vk.bindBufferMemory(vkDevice, *vertexBuffer, vertexBufferMemory->getMemory(), vertexBufferMemory->getOffset()));

	const VkDeviceSize						imageSizeBytes			= (VkDeviceSize)(sizeof(deUint32)*renderSize.x()*renderSize.y());
	const VkBufferCreateInfo				readImageBufferParams	=
	{
		VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// sType
		DE_NULL,									// pNext
		(VkBufferCreateFlags)0u,					// flags
		imageSizeBytes,								// size
		VK_BUFFER_USAGE_TRANSFER_DST_BIT,			// usage
		VK_SHARING_MODE_EXCLUSIVE,					// sharingMode
		1u,											// queueFamilyIndexCount
		&queueFamilyIndex,							// pQueueFamilyIndices
	};
	const Unique<VkBuffer>					readImageBuffer			(createBuffer(vk, vkDevice, &readImageBufferParams));
	const UniquePtr<Allocation>				readImageBufferMemory	(memAlloc.allocate(getBufferMemoryRequirements(vk, vkDevice, *readImageBuffer), MemoryRequirement::HostVisible));

	VK_CHECK(vk.bindBufferMemory(vkDevice, *readImageBuffer, readImageBufferMemory->getMemory(), readImageBufferMemory->getOffset()));

	const VkImageCreateInfo					imageParams				=
	{
		VK_STRUCTURE_TYPE_IMAGE_CREATE_INFO,									// sType
		DE_NULL,																// pNext
		0u,																		// flags
		VK_IMAGE_TYPE_2D,														// imageType
		VK_FORMAT_R8G8B8A8_UNORM,												// format
		{ (deUint32)renderSize.x(), (deUint32)renderSize.y(), 1 },				// extent
		1u,																		// mipLevels
		1u,																		// arraySize
		VK_SAMPLE_COUNT_1_BIT,													// samples
		VK_IMAGE_TILING_OPTIMAL,												// tiling
		VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT|VK_IMAGE_USAGE_TRANSFER_SRC_BIT,	// usage
		VK_SHARING_MODE_EXCLUSIVE,												// sharingMode
		1u,																		// queueFamilyIndexCount
		&queueFamilyIndex,														// pQueueFamilyIndices
		VK_IMAGE_LAYOUT_UNDEFINED,												// initialLayout
	};

	const Unique<VkImage>					image					(createImage(vk, vkDevice, &imageParams));
	const UniquePtr<Allocation>				imageMemory				(memAlloc.allocate(getImageMemoryRequirements(vk, vkDevice, *image), MemoryRequirement::Any));

	VK_CHECK(vk.bindImageMemory(vkDevice, *image, imageMemory->getMemory(), imageMemory->getOffset()));

	const VkAttachmentDescription			colorAttDesc			=
	{
		0u,												// flags
		VK_FORMAT_R8G8B8A8_UNORM,						// format
		VK_SAMPLE_COUNT_1_BIT,							// samples
		VK_ATTACHMENT_LOAD_OP_CLEAR,					// loadOp
		VK_ATTACHMENT_STORE_OP_STORE,					// storeOp
		VK_ATTACHMENT_LOAD_OP_DONT_CARE,				// stencilLoadOp
		VK_ATTACHMENT_STORE_OP_DONT_CARE,				// stencilStoreOp
		VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,		// initialLayout
		VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,		// finalLayout
	};
	const VkAttachmentReference				colorAttRef				=
	{
		0u,												// attachment
		VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,		// layout
	};
	const VkSubpassDescription				subpassDesc				=
	{
		(VkSubpassDescriptionFlags)0u,					// flags
		VK_PIPELINE_BIND_POINT_GRAPHICS,				// pipelineBindPoint
		0u,												// inputAttachmentCount
		DE_NULL,										// pInputAttachments
		1u,												// colorAttachmentCount
		&colorAttRef,									// pColorAttachments
		DE_NULL,										// pResolveAttachments
		DE_NULL,										// depthStencilAttachment
		0u,												// preserveAttachmentCount
		DE_NULL,										// pPreserveAttachments
	};
	const VkRenderPassCreateInfo			renderPassParams		=
	{
		VK_STRUCTURE_TYPE_RENDER_PASS_CREATE_INFO,		// sType
		DE_NULL,										// pNext
		0u,												// flags
		1u,												// attachmentCount
		&colorAttDesc,									// pAttachments
		1u,												// subpassCount
		&subpassDesc,									// pSubpasses
		0u,												// dependencyCount
		DE_NULL,										// pDependencies
	};
	const Unique<VkRenderPass>				renderPass				(createRenderPass(vk, vkDevice, &renderPassParams));

	const VkImageViewCreateInfo				colorAttViewParams		=
	{
		VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,		// sType
		DE_NULL,										// pNext
		0u,												// flags
		*image,											// image
		VK_IMAGE_VIEW_TYPE_2D,							// viewType
		VK_FORMAT_R8G8B8A8_UNORM,						// format
		{
			VK_COMPONENT_SWIZZLE_R,
			VK_COMPONENT_SWIZZLE_G,
			VK_COMPONENT_SWIZZLE_B,
			VK_COMPONENT_SWIZZLE_A
		},												// components
		{
			VK_IMAGE_ASPECT_COLOR_BIT,						// aspectMask
			0u,												// baseMipLevel
			1u,												// levelCount
			0u,												// baseArrayLayer
			1u,												// layerCount
		},												// subresourceRange
	};
	const Unique<VkImageView>				colorAttView			(createImageView(vk, vkDevice, &colorAttViewParams));

	// Pipeline layout
	const VkPipelineLayoutCreateInfo		pipelineLayoutParams	=
	{
		VK_STRUCTURE_TYPE_PIPELINE_LAYOUT_CREATE_INFO,			// sType
		DE_NULL,												// pNext
		(vk::VkPipelineLayoutCreateFlags)0,
		0u,														// setLayoutCount
		DE_NULL,												// pSetLayouts
		0u,														// pushConstantRangeCount
		DE_NULL,												// pPushConstantRanges
	};
	const Unique<VkPipelineLayout>			pipelineLayout			(createPipelineLayout(vk, vkDevice, &pipelineLayoutParams));

	// Shaders
	const Unique<VkShaderModule>			vertShaderModule		(createShaderModule(vk, vkDevice, context.getBinaryCollection().get("vert"), 0));
	const Unique<VkShaderModule>			fragShaderModule		(createShaderModule(vk, vkDevice, context.getBinaryCollection().get("frag"), 0));

	// Pipeline
	const VkSpecializationInfo				emptyShaderSpecParams	=
	{
		0u,														// mapEntryCount
		DE_NULL,												// pMap
		0,														// dataSize
		DE_NULL,												// pData
	};
	const VkPipelineShaderStageCreateInfo	shaderStageParams[]	=
	{
		{
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	// sType
			DE_NULL,												// pNext
			0u,														// flags
			VK_SHADER_STAGE_VERTEX_BIT,								// stage
			*vertShaderModule,										// module
			"main",													// pName
			&emptyShaderSpecParams,									// pSpecializationInfo
		},
		{
			VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_CREATE_INFO,	// sType
			DE_NULL,												// pNext
			0u,														// flags
			VK_SHADER_STAGE_FRAGMENT_BIT,							// stage
			*fragShaderModule,										// module
			"main",													// pName
			&emptyShaderSpecParams,									// pSpecializationInfo
		}
	};
	const VkPipelineDepthStencilStateCreateInfo	depthStencilParams		=
	{
		VK_STRUCTURE_TYPE_PIPELINE_DEPTH_STENCIL_STATE_CREATE_INFO,	// sType
		DE_NULL,													// pNext
		0u,															// flags
		DE_FALSE,													// depthTestEnable
		DE_FALSE,													// depthWriteEnable
		VK_COMPARE_OP_ALWAYS,										// depthCompareOp
		DE_FALSE,													// depthBoundsTestEnable
		DE_FALSE,													// stencilTestEnable
		{
			VK_STENCIL_OP_KEEP,											// failOp
			VK_STENCIL_OP_KEEP,											// passOp
			VK_STENCIL_OP_KEEP,											// depthFailOp
			VK_COMPARE_OP_ALWAYS,										// compareOp
			0u,															// compareMask
			0u,															// writeMask
			0u,															// reference
		},															// front
		{
			VK_STENCIL_OP_KEEP,											// failOp
			VK_STENCIL_OP_KEEP,											// passOp
			VK_STENCIL_OP_KEEP,											// depthFailOp
			VK_COMPARE_OP_ALWAYS,										// compareOp
			0u,															// compareMask
			0u,															// writeMask
			0u,															// reference
		},															// back;
		0.0f,														//	float				minDepthBounds;
		1.0f,														//	float				maxDepthBounds;
	};
	const VkViewport						viewport0				=
	{
		0.0f,														// x
		0.0f,														// y
		(float)renderSize.x(),										// width
		(float)renderSize.y(),										// height
		0.0f,														// minDepth
		1.0f,														// maxDepth
	};
	const VkRect2D							scissor0				=
	{
		{
			0u,															// x
			0u,															// y
		},															// offset
		{
			(deUint32)renderSize.x(),									// width
			(deUint32)renderSize.y(),									// height
		},															// extent;
	};
	const VkPipelineViewportStateCreateInfo		viewportParams			=
	{
		VK_STRUCTURE_TYPE_PIPELINE_VIEWPORT_STATE_CREATE_INFO,		// sType
		DE_NULL,													// pNext
		0u,															// flags
		1u,															// viewportCount
		&viewport0,													// pViewports
		1u,															// scissorCount
		&scissor0													// pScissors
	};
	const VkSampleMask							sampleMask				= ~0u;
	const VkPipelineMultisampleStateCreateInfo	multisampleParams		=
	{
		VK_STRUCTURE_TYPE_PIPELINE_MULTISAMPLE_STATE_CREATE_INFO,	// sType
		DE_NULL,													// pNext
		0u,															// flags
		VK_SAMPLE_COUNT_1_BIT,										// rasterizationSamples
		VK_FALSE,													// sampleShadingEnable
		0.0f,														// minSampleShading
		&sampleMask,												// sampleMask
		VK_FALSE,													// alphaToCoverageEnable
		VK_FALSE,													// alphaToOneEnable
	};
	const VkPipelineRasterizationStateCreateInfo	rasterParams		=
	{
		VK_STRUCTURE_TYPE_PIPELINE_RASTERIZATION_STATE_CREATE_INFO,	// sType
		DE_NULL,													// pNext
		0u,															// flags
		VK_TRUE,													// depthClampEnable
		VK_FALSE,													// rasterizerDiscardEnable
		VK_POLYGON_MODE_FILL,										// polygonMode
		VK_CULL_MODE_NONE,											// cullMode
		VK_FRONT_FACE_COUNTER_CLOCKWISE,							// frontFace
		VK_FALSE,													// depthBiasEnable
		0.0f,														// depthBiasConstantFactor
		0.0f,														// depthBiasClamp
		0.0f,														// depthBiasSlopeFactor
		1.0f,														// lineWidth
	};
	const VkPipelineInputAssemblyStateCreateInfo	inputAssemblyParams	=
	{
		VK_STRUCTURE_TYPE_PIPELINE_INPUT_ASSEMBLY_STATE_CREATE_INFO,	// sType
		DE_NULL,														// pNext
		0u,																// flags
		VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST,							// topology
		DE_FALSE,														// primitiveRestartEnable
	};
	const VkVertexInputBindingDescription		vertexBinding0			=
	{
		0u,														// binding
		(deUint32)sizeof(tcu::Vec4),							// stride
		VK_VERTEX_INPUT_RATE_VERTEX,							// inputRate
	};
	const VkVertexInputAttributeDescription		vertexAttrib0			=
	{
		0u,														// location
		0u,														// binding
		VK_FORMAT_R32G32B32A32_SFLOAT,							// format
		0u,														// offset
	};
	const VkPipelineVertexInputStateCreateInfo	vertexInputStateParams	=
	{
		VK_STRUCTURE_TYPE_PIPELINE_VERTEX_INPUT_STATE_CREATE_INFO,	// sType
		DE_NULL,													// pNext
		0u,															// flags
		1u,															// vertexBindingDescriptionCount
		&vertexBinding0,											// pVertexBindingDescriptions
		1u,															// vertexAttributeDescriptionCount
		&vertexAttrib0,												// pVertexAttributeDescriptions
	};
	const VkPipelineColorBlendAttachmentState	attBlendParams			=
	{
		VK_FALSE,													// blendEnable
		VK_BLEND_FACTOR_ONE,										// srcColorBlendFactor
		VK_BLEND_FACTOR_ZERO,										// dstColorBlendFactor
		VK_BLEND_OP_ADD,											// colorBlendOp
		VK_BLEND_FACTOR_ONE,										// srcAlphaBlendFactor
		VK_BLEND_FACTOR_ZERO,										// dstAlphaBlendFactor
		VK_BLEND_OP_ADD,											// alphaBlendOp
		(VK_COLOR_COMPONENT_R_BIT|
		 VK_COLOR_COMPONENT_G_BIT|
		 VK_COLOR_COMPONENT_B_BIT|
		 VK_COLOR_COMPONENT_A_BIT),									// colorWriteMask
	};
	const VkPipelineColorBlendStateCreateInfo	blendParams				=
	{
		VK_STRUCTURE_TYPE_PIPELINE_COLOR_BLEND_STATE_CREATE_INFO,	// sType
		DE_NULL,													// pNext
		0u,															// flags
		DE_FALSE,													// logicOpEnable
		VK_LOGIC_OP_COPY,											// logicOp
		1u,															// attachmentCount
		&attBlendParams,											// pAttachments
		{ 0.0f, 0.0f, 0.0f, 0.0f },									// blendConstants[4]
	};
	const VkGraphicsPipelineCreateInfo		pipelineParams			=
	{
		VK_STRUCTURE_TYPE_GRAPHICS_PIPELINE_CREATE_INFO,		// sType
		DE_NULL,												// pNext
		0u,														// flags
		(deUint32)DE_LENGTH_OF_ARRAY(shaderStageParams),		// stageCount
		shaderStageParams,										// pStages
		&vertexInputStateParams,								// pVertexInputState
		&inputAssemblyParams,									// pInputAssemblyState
		DE_NULL,												// pTessellationState
		&viewportParams,										// pViewportState
		&rasterParams,											// pRasterizationState
		&multisampleParams,										// pMultisampleState
		&depthStencilParams,									// pDepthStencilState
		&blendParams,											// pColorBlendState
		(const VkPipelineDynamicStateCreateInfo*)DE_NULL,		// pDynamicState
		*pipelineLayout,										// layout
		*renderPass,											// renderPass
		0u,														// subpass
		DE_NULL,												// basePipelineHandle
		0u,														// basePipelineIndex
	};

	const Unique<VkPipeline>				pipeline				(createGraphicsPipeline(vk, vkDevice, DE_NULL, &pipelineParams));

	// Framebuffer
	const VkFramebufferCreateInfo			framebufferParams		=
	{
		VK_STRUCTURE_TYPE_FRAMEBUFFER_CREATE_INFO,				// sType
		DE_NULL,												// pNext
		0u,														// flags
		*renderPass,											// renderPass
		1u,														// attachmentCount
		&*colorAttView,											// pAttachments
		(deUint32)renderSize.x(),								// width
		(deUint32)renderSize.y(),								// height
		1u,														// layers
	};
	const Unique<VkFramebuffer>				framebuffer				(createFramebuffer(vk, vkDevice, &framebufferParams));

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					// sType
		DE_NULL,													// pNext
		VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,			// flags
		queueFamilyIndex,											// queueFamilyIndex
	};
	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, vkDevice, &cmdPoolParams));

	// Command buffer
	const VkCommandBufferAllocateInfo		cmdBufParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,			// sType
		DE_NULL,												// pNext
		*cmdPool,												// pool
		VK_COMMAND_BUFFER_LEVEL_PRIMARY,						// level
		1u,														// bufferCount
	};
	const Unique<VkCommandBuffer>			cmdBuf					(allocateCommandBuffer(vk, vkDevice, &cmdBufParams));

	const VkCommandBufferBeginInfo			cmdBufBeginParams		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,			// sType
		DE_NULL,												// pNext
		0u,														// flags
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	// Record commands
	VK_CHECK(vk.beginCommandBuffer(*cmdBuf, &cmdBufBeginParams));

	{
		const VkMemoryBarrier		vertFlushBarrier	=
		{
			VK_STRUCTURE_TYPE_MEMORY_BARRIER,			// sType
			DE_NULL,									// pNext
			VK_ACCESS_HOST_WRITE_BIT,					// srcAccessMask
			VK_ACCESS_VERTEX_ATTRIBUTE_READ_BIT,		// dstAccessMask
		};
		const VkImageMemoryBarrier	colorAttBarrier		=
		{
			VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// sType
			DE_NULL,									// pNext
			0u,											// srcAccessMask
			(VK_ACCESS_COLOR_ATTACHMENT_READ_BIT|
			 VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT),		// dstAccessMask
			VK_IMAGE_LAYOUT_UNDEFINED,					// oldLayout
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,	// newLayout
			queueFamilyIndex,							// srcQueueFamilyIndex
			queueFamilyIndex,							// dstQueueFamilyIndex
			*image,										// image
			{
				VK_IMAGE_ASPECT_COLOR_BIT,					// aspectMask
				0u,											// baseMipLevel
				1u,											// levelCount
				0u,											// baseArrayLayer
				1u,											// layerCount
			}											// subresourceRange
		};
		vk.cmdPipelineBarrier(*cmdBuf, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_ALL_COMMANDS_BIT, (VkDependencyFlags)0, 1, &vertFlushBarrier, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &colorAttBarrier);
	}

	{
		const VkClearValue			clearValue		= makeClearValueColorF32(clearColor[0],
																			 clearColor[1],
																			 clearColor[2],
																			 clearColor[3]);
		const VkRenderPassBeginInfo	passBeginParams	=
		{
			VK_STRUCTURE_TYPE_RENDER_PASS_BEGIN_INFO,			// sType
			DE_NULL,											// pNext
			*renderPass,										// renderPass
			*framebuffer,										// framebuffer
			{
				{ 0, 0 },
				{ (deUint32)renderSize.x(), (deUint32)renderSize.y() }
			},													// renderArea
			1u,													// clearValueCount
			&clearValue,										// pClearValues
		};
		vk.cmdBeginRenderPass(*cmdBuf, &passBeginParams, VK_SUBPASS_CONTENTS_INLINE);
	}

	vk.cmdBindPipeline(*cmdBuf, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);
	{
		const VkDeviceSize bindingOffset = 0;
		vk.cmdBindVertexBuffers(*cmdBuf, 0u, 1u, &vertexBuffer.get(), &bindingOffset);
	}
	vk.cmdDraw(*cmdBuf, 3u, 1u, 0u, 0u);
	vk.cmdEndRenderPass(*cmdBuf);

	{
		const VkImageMemoryBarrier	renderFinishBarrier	=
		{
			VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,		// sType
			DE_NULL,									// pNext
			VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,		// outputMask
			VK_ACCESS_TRANSFER_READ_BIT,				// inputMask
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,	// oldLayout
			VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,		// newLayout
			queueFamilyIndex,							// srcQueueFamilyIndex
			queueFamilyIndex,							// dstQueueFamilyIndex
			*image,										// image
			{
				VK_IMAGE_ASPECT_COLOR_BIT,					// aspectMask
				0u,											// baseMipLevel
				1u,											// mipLevels
				0u,											// baseArraySlice
				1u,											// arraySize
			}											// subresourceRange
		};
		vk.cmdPipelineBarrier(*cmdBuf, VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &renderFinishBarrier);
	}

	{
		const VkBufferImageCopy	copyParams	=
		{
			(VkDeviceSize)0u,						// bufferOffset
			(deUint32)renderSize.x(),				// bufferRowLength
			(deUint32)renderSize.y(),				// bufferImageHeight
			{
				VK_IMAGE_ASPECT_COLOR_BIT,				// aspectMask
				0u,										// mipLevel
				0u,										// baseArrayLayer
				1u,										// layerCount
			},										// imageSubresource
			{ 0u, 0u, 0u },							// imageOffset
			{
				(deUint32)renderSize.x(),
				(deUint32)renderSize.y(),
				1u
			}										// imageExtent
		};
		vk.cmdCopyImageToBuffer(*cmdBuf, *image, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *readImageBuffer, 1u, &copyParams);
	}

	{
		const VkBufferMemoryBarrier	copyFinishBarrier	=
		{
			VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// sType
			DE_NULL,									// pNext
			VK_ACCESS_TRANSFER_WRITE_BIT,				// srcAccessMask
			VK_ACCESS_HOST_READ_BIT,					// dstAccessMask
			queueFamilyIndex,							// srcQueueFamilyIndex
			queueFamilyIndex,							// dstQueueFamilyIndex
			*readImageBuffer,							// buffer
			0u,											// offset
			imageSizeBytes								// size
		};
		vk.cmdPipelineBarrier(*cmdBuf, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &copyFinishBarrier, 0, (const VkImageMemoryBarrier*)DE_NULL);
	}

	VK_CHECK(vk.endCommandBuffer(*cmdBuf));

	// Upload vertex data
	{
		const VkMappedMemoryRange	range			=
		{
			VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE,	// sType
			DE_NULL,								// pNext
			vertexBufferMemory->getMemory(),		// memory
			0,										// offset
			(VkDeviceSize)sizeof(vertices),			// size
		};
		void*						vertexBufPtr	= vertexBufferMemory->getHostPtr();

		deMemcpy(vertexBufPtr, &vertices[0], sizeof(vertices));
		VK_CHECK(vk.flushMappedMemoryRanges(vkDevice, 1u, &range));
	}

	// Submit & wait for completion
	{
		const VkFenceCreateInfo	fenceParams	=
		{
			VK_STRUCTURE_TYPE_FENCE_CREATE_INFO,	// sType
			DE_NULL,								// pNext
			0u,										// flags
		};
		const VkSubmitInfo		submitInfo	=
		{
			VK_STRUCTURE_TYPE_SUBMIT_INFO,			// sType
			DE_NULL,								// pNext
			0u,										// waitSemaphoreCount
			DE_NULL,								// pWaitSemaphores
			(const VkPipelineStageFlags*)DE_NULL,
			1u,										// commandBufferCount
			&cmdBuf.get(),							// pCommandBuffers
			0u,										// signalSemaphoreCount
			DE_NULL,								// pSignalSemaphores
		};
		const Unique<VkFence>	fence		(createFence(vk, vkDevice, &fenceParams));

		VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));
		VK_CHECK(vk.waitForFences(vkDevice, 1u, &fence.get(), DE_TRUE, ~0ull));
	}

	// Read results, render reference, compare
	{
		const tcu::TextureFormat			tcuFormat		= vk::mapVkFormat(colorFormat);
		const VkMappedMemoryRange			range			=
		{
			VK_STRUCTURE_TYPE_MAPPED_MEMORY_RANGE,	// sType
			DE_NULL,								// pNext
			readImageBufferMemory->getMemory(),		// memory
			0,										// offset
			imageSizeBytes,							// size
		};
		const tcu::ConstPixelBufferAccess	resultAccess	(tcuFormat, renderSize.x(), renderSize.y(), 1, readImageBufferMemory->getHostPtr());

		VK_CHECK(vk.invalidateMappedMemoryRanges(vkDevice, 1u, &range));

		{
			tcu::TextureLevel	refImage		(tcuFormat, renderSize.x(), renderSize.y());
			const tcu::UVec4	threshold		(0u);
			const tcu::IVec3	posDeviation	(1,1,0);

			tcu::clear(refImage.getAccess(), clearColor);
			renderReferenceTriangle(refImage.getAccess(), vertices);

			if (tcu::intThresholdPositionDeviationCompare(context.getTestContext().getLog(),
														  "ComparisonResult",
														  "Image comparison result",
														  refImage.getAccess(),
														  resultAccess,
														  threshold,
														  posDeviation,
														  false,
														  tcu::COMPARE_LOG_RESULT))
				return tcu::TestStatus::pass("Rendering succeeded");
			else
				return tcu::TestStatus::fail("Image comparison failed");
		}
	}

	return tcu::TestStatus::pass("Rendering succeeded");
}